

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O0

void __thiscall sockpp::unix_address::unix_address(unix_address *this,string *path,error_code *ec)

{
  ulong uVar1;
  long lVar2;
  unsigned_long *puVar3;
  void *__src;
  error_code eVar4;
  unsigned_long local_50;
  size_t local_48;
  size_t n;
  error_category *peStack_38;
  undefined4 uStack_2c;
  error_code *local_20;
  error_code *ec_local;
  string *path_local;
  unix_address *this_local;
  
  local_20 = ec;
  ec_local = (error_code *)path;
  path_local = (string *)this;
  sock_address::sock_address(&this->super_sock_address);
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__unix_address_00119ce0;
  (this->addr_).sun_family = 0;
  memset((this->addr_).sun_path,0,0x6c);
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 0x6d) {
    std::error_code::error_code((error_code *)&n);
    *(size_t *)local_20 = n;
    local_20->_M_cat = peStack_38;
    (this->addr_).sun_family = 1;
    lVar2 = std::__cxx11::string::length();
    local_50 = lVar2 + 1;
    puVar3 = std::min<unsigned_long>(&local_50,&MAX_PATH_NAME);
    local_48 = *puVar3;
    __src = (void *)std::__cxx11::string::c_str();
    memcpy((this->addr_).sun_path,__src,local_48);
  }
  else {
    eVar4 = std::make_error_code(invalid_argument);
    *(ulong *)local_20 = CONCAT44(uStack_2c,eVar4._M_value);
    local_20->_M_cat = eVar4._M_cat;
  }
  return;
}

Assistant:

unix_address::unix_address(const string& path, error_code& ec) noexcept {
    if (path.length() > MAX_PATH_NAME) {
        ec = make_error_code(errc::invalid_argument);
    }
    else {
        ec = error_code{};
        addr_.sun_family = ADDRESS_FAMILY;
        // Remember, if len==MAX, there's no NUL terminator
        const size_t n = std::min(path.length() + 1, MAX_PATH_NAME);
        std::memcpy(addr_.sun_path, path.c_str(), n);
    }
}